

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weibull_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::weibull_dist<double>::operator()(weibull_dist<double> *this,lcg64_shift *r)

{
  param_type *in_RDI;
  result_type_conflict2 rVar1;
  double dVar2;
  result_type_conflict2 rVar3;
  
  rVar1 = param_type::theta(in_RDI);
  utility::uniformoc<double,trng::lcg64_shift>((lcg64_shift *)0x34b03c);
  dVar2 = math::ln(1.7060052166303e-317);
  rVar3 = param_type::beta(in_RDI);
  dVar2 = pow(-dVar2,1.0 / rVar3);
  return rVar1 * dVar2;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return P.theta() * math::pow(-math::ln(utility::uniformoc<result_type>(r)), 1 / P.beta());
    }